

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O0

void sg_init_shader(sg_shader shd_id,sg_shader_desc *desc)

{
  undefined1 local_bc0 [8];
  sg_shader_desc desc_def;
  sg_shader_desc *desc_local;
  sg_shader shd_id_local;
  
  desc_def._2976_8_ = desc;
  if (_sg.valid) {
    _sg_shader_desc_defaults((sg_shader_desc *)local_bc0,desc);
    _sg_init_shader(shd_id,(sg_shader_desc *)local_bc0);
    return;
  }
  __assert_fail("_sg.valid",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                ,0x3a57,"void sg_init_shader(sg_shader, const sg_shader_desc *)");
}

Assistant:

inline void sg_init_shader(sg_shader shd_id, const sg_shader_desc& desc) { return sg_init_shader(shd_id, &desc); }